

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_notif(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  long *plVar7;
  lysp_ext_instance *plVar8;
  long lVar9;
  lysp_restr *must_p;
  lysp_ext_instance *plVar10;
  lysp_node *plVar11;
  
  plVar11 = pnode[1].parent;
  if (plVar11 != (lysp_node *)0x0) {
    plVar1 = node[1].module;
    if (plVar1 == (lys_module *)0x0) {
      lVar9 = 0;
      plVar7 = (long *)calloc(1,(long)plVar11[-1].exts * 0x38 + 8);
    }
    else {
      lVar9 = *(long *)&plVar1[-1].implemented;
      plVar7 = (long *)realloc(&plVar1[-1].implemented,
                               ((long)&(plVar11[-1].exts)->name +
                               *(long *)&plVar1[-1].implemented + lVar9) * 0x38 + 8);
    }
    if (plVar7 == (long *)0x0) {
      bVar3 = false;
      LVar5 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      bVar4 = true;
    }
    else {
      node[1].module = (lys_module *)(plVar7 + 1);
      LVar5 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar10 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar10 = pnode[1].parent[-1].exts;
      }
      memset(plVar7 + *plVar7 * 7 + 1,0,((long)&plVar10->name + lVar9) * 0x38);
      bVar3 = true;
      bVar4 = false;
    }
    if (bVar3) {
      plVar10 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar9 = 0;
      LVar6 = LVar5;
      do {
        LVar5 = LVar6;
        plVar11 = pnode[1].parent;
        if (plVar11 == (lysp_node *)0x0) {
          plVar8 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar8 = plVar11[-1].exts;
        }
        plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
        if (plVar8 <= plVar10) {
          bVar4 = false;
          goto LAB_0014cd46;
        }
        plVar1 = node[1].module;
        uVar2 = *(ulong *)&plVar1[-1].implemented;
        must_p = (lysp_restr *)((long)&plVar11->parent + lVar9);
        lVar9 = lVar9 + 0x40;
        *(ulong *)&plVar1[-1].implemented = uVar2 + 1;
        LVar5 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)
                                 (&plVar1->ctx + (-(ulong)(plVar1 == (lys_module *)0x0) | uVar2) * 7
                                 ));
        LVar6 = LY_SUCCESS;
      } while (LVar5 == LY_SUCCESS);
      bVar4 = true;
    }
LAB_0014cd46:
    if (bVar4) {
      return LVar5;
    }
  }
  LVar5 = lysc_unres_must_add(ctx,node,pnode);
  LVar6 = LY_EMEM;
  if (LVar5 == LY_SUCCESS) {
    plVar11 = (lysp_node *)pnode[1].name;
    while( true ) {
      if (plVar11 == (lysp_node *)0x0) {
        LVar5 = lys_compile_node_augments(ctx,node);
        return LVar5;
      }
      LVar6 = lys_compile_node(ctx,plVar11,node,0,(ly_set *)0x0);
      if (LVar6 != LY_SUCCESS) break;
      plVar11 = plVar11->next;
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
lys_compile_node_notif(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node_notif *notif_p = (struct lysp_node_notif *)pnode;
    struct lysc_node_notif *notif = (struct lysc_node_notif *)node;
    struct lysp_node *child_p;

    COMPILE_ARRAY_GOTO(ctx, notif_p->musts, notif->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    LY_LIST_FOR(notif_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}